

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O1

void Abc_RwrExpWithCut_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,int fUseA)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  do {
    lVar2 = (long)vLeaves->nSize;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if ((Abc_Obj_t *)vLeaves->pArray[lVar3] == pNode) goto LAB_0029c143;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if (0 < vLeaves->nSize) {
      lVar3 = 0;
      do {
        if (vLeaves->pArray[lVar3] == (void *)((ulong)pNode ^ 1)) {
LAB_0029c143:
          uVar1 = *(uint *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14);
          if (fUseA == 0) {
            uVar1 = uVar1 | 0x20;
          }
          else {
            uVar1 = uVar1 | 0x10;
          }
          *(uint *)(((ulong)pNode & 0xfffffffffffffffe) + 0x14) = uVar1;
          return;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                    ,0x17c,"void Abc_RwrExpWithCut_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    Abc_RwrExpWithCut_rec
              ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vLeaves,fUseA);
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
  } while( true );
}

Assistant:

void Abc_RwrExpWithCut_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, int fUseA )
{
    if ( Vec_PtrFind(vLeaves, pNode) >= 0 || Vec_PtrFind(vLeaves, Abc_ObjNot(pNode)) >= 0 )
    {
        if ( fUseA )
            Abc_ObjRegular(pNode)->fMarkA = 1;
        else
            Abc_ObjRegular(pNode)->fMarkB = 1;
        return;
    }
    assert( Abc_ObjIsNode(pNode) );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin0(pNode), vLeaves, fUseA );
    Abc_RwrExpWithCut_rec( Abc_ObjFanin1(pNode), vLeaves, fUseA );
}